

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCoding.h
# Opt level: O1

void __thiscall
llbuild::basic::BinaryDecoder::read<llbuild::basic::FileTimestamp>
          (BinaryDecoder *this,FileTimestamp *value)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = read32(this);
  uVar2 = read32(this);
  value->seconds = CONCAT44(uVar2,uVar1);
  uVar1 = read32(this);
  uVar2 = read32(this);
  value->nanoseconds = CONCAT44(uVar2,uVar1);
  return;
}

Assistant:

void read(T& value) {
    BinaryCodingTraits<T>::decode(value, *this);
  }